

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * configDir_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_50 [32];
  string local_30 [8];
  string userDir;
  
  getUserDir_abi_cxx11_();
  std::__cxx11::string::string(local_50,local_30);
  path<std::__cxx11::string,char_const*>(in_RDI,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string configDir() {
    std::string userDir = getUserDir();
    return path(userDir, ".sshba");
}